

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O3

DdNode * Cudd_addGeneralVectorCompose(DdManager *dd,DdNode *f,DdNode **vectorOn,DdNode **vectorOff)

{
  int *piVar1;
  DdHalfWord DVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  uint uVar5;
  DdHashTable *table;
  DdNode *pDVar6;
  uint uVar7;
  uint uVar8;
  uint deepest;
  
  dd->reordered = 0;
  table = cuddHashTableInit(dd,1,2);
  do {
    if (table == (DdHashTable *)0x0) {
      return (DdNode *)0x0;
    }
    uVar7 = dd->size;
    uVar5 = (int)uVar7 >> 0x1f & uVar7;
    uVar8 = uVar7;
    do {
      uVar7 = uVar7 - 1;
      deepest = uVar5 - 1;
      if ((int)uVar8 < 1) break;
      DVar2 = dd->invperm[uVar7];
      pDVar6 = vectorOn[(int)DVar2];
      if ((((pDVar6->index != DVar2) || (pDVar3 = vectorOff[(int)DVar2], pDVar3->index != DVar2)) ||
          (pDVar4 = (pDVar6->type).kids.T, pDVar4 != dd->one)) ||
         ((pDVar6 = (pDVar6->type).kids.E, pDVar6 != dd->zero || ((pDVar3->type).kids.T != pDVar6)))
         ) {
        deepest = uVar8 - 1;
        break;
      }
      deepest = uVar8 - 1;
      uVar8 = deepest;
    } while ((pDVar3->type).kids.E == pDVar4);
    pDVar6 = cuddAddGeneralVectorComposeRecur(dd,table,f,vectorOn,vectorOff,deepest);
    if (pDVar6 == (DdNode *)0x0) {
      cuddHashTableQuit(table);
      if (dd->reordered != 1) {
        return (DdNode *)0x0;
      }
    }
    else {
      piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      cuddHashTableQuit(table);
      if (dd->reordered != 1) {
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar6;
      }
    }
    dd->reordered = 0;
    table = cuddHashTableInit(dd,1,2);
  } while( true );
}

Assistant:

DdNode *
Cudd_addGeneralVectorCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vectorOn,
  DdNode ** vectorOff)
{
    DdHashTable         *table;
    DdNode              *res;
    int                 deepest;
    int                 i;

    do {
        dd->reordered = 0;
        /* Initialize local cache. */
        table = cuddHashTableInit(dd,1,2);
        if (table == NULL) return(NULL);

        /* Find deepest real substitution. */
        for (deepest = dd->size - 1; deepest >= 0; deepest--) {
            i = dd->invperm[deepest];
            if (!ddIsIthAddVarPair(dd,vectorOn[i],vectorOff[i],i)) {
                break;
            }
        }

        /* Recursively solve the problem. */
        res = cuddAddGeneralVectorComposeRecur(dd,table,f,vectorOn,
                                               vectorOff,deepest);
        if (res != NULL) cuddRef(res);

        /* Dispose of local cache. */
        cuddHashTableQuit(table);
    } while (dd->reordered == 1);

    if (res != NULL) cuddDeref(res);
    return(res);

}